

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall
duckdb::ZSTDCompressionState::ZSTDCompressionState
          (ZSTDCompressionState *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
          *analyze_state_p)

{
  unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true> *this_00
  ;
  BufferHandle *this_01;
  pointer pZVar1;
  ColumnCheckpointState *pCVar2;
  CompressionFunction *pCVar3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  
  pZVar1 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(analyze_state_p);
  (this->super_CompressionState).info.block_manager =
       (pZVar1->super_AnalyzeState).info.block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__ZSTDCompressionState_027a5720;
  this_00 = &this->analyze_state;
  (this->analyze_state).
  super_unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ZSTDAnalyzeState_*,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
  .super__Head_base<0UL,_duckdb::ZSTDAnalyzeState_*,_false>._M_head_impl =
       (analyze_state_p->
       super_unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ZSTDAnalyzeState_*,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
       .super__Head_base<0UL,_duckdb::ZSTDAnalyzeState_*,_false>._M_head_impl;
  (analyze_state_p->
  super_unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ZSTDAnalyzeState_*,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
  .super__Head_base<0UL,_duckdb::ZSTDAnalyzeState_*,_false>._M_head_impl = (ZSTDAnalyzeState *)0x0;
  this->checkpoint_data = checkpoint_data;
  pCVar2 = ColumnDataCheckpointData::GetCheckpointState(checkpoint_data);
  this->partial_block_manager = pCVar2->partial_block_manager;
  pCVar3 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_ZSTD);
  this->function = pCVar3;
  this_01 = &this->segment_handle;
  this->segment_count = 0;
  this->total_segment_count = 0;
  this->vectors_in_last_segment = 0;
  this->vectors_per_segment = 0;
  (this->segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(this_01);
  BufferHandle::BufferHandle(this->extra_pages);
  BufferHandle::BufferHandle(this->extra_pages + 1);
  this->block_id = -1;
  this->tuple_count = 0;
  (this->current_buffer).ptr = (BufferHandle *)0x0;
  (this->vector_lengths_buffer).ptr = (BufferHandle *)0x0;
  this->vector_count = 0;
  this->vector_in_segment_count = 0;
  *(undefined8 *)((long)&this->vector_in_segment_count + 1) = 0;
  *(undefined8 *)((long)&this->total_vector_count + 1) = 0;
  this->uncompressed_size = 0;
  this->compressed_size = 0;
  pZVar1 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  this->total_vector_count = ((pZVar1->count >> 0xb) + 1) - (ulong)((pZVar1->count & 0x7ff) == 0);
  pZVar1 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  this->total_segment_count = pZVar1->segment_count;
  pZVar1 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  this->vectors_per_segment = pZVar1->vectors_per_segment;
  this->segment_count = 0;
  this->tuple_count = 0;
  this->vector_count = 0;
  this->vector_in_segment_count = 0;
  iVar4 = NewSegment(this);
  SetCurrentBuffer(this,this_01);
  pdVar5 = BufferHandle::Ptr(this_01);
  this->current_buffer_ptr = pdVar5 + iVar4;
  return;
}

Assistant:

explicit ZSTDCompressionState(ColumnDataCheckpointData &checkpoint_data,
	                              unique_ptr<ZSTDAnalyzeState> &&analyze_state_p)
	    : CompressionState(analyze_state_p->info), analyze_state(std::move(analyze_state_p)),
	      checkpoint_data(checkpoint_data),
	      partial_block_manager(checkpoint_data.GetCheckpointState().GetPartialBlockManager()),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ZSTD)) {

		total_vector_count = GetVectorCount(analyze_state->count);
		total_segment_count = analyze_state->segment_count;
		vectors_per_segment = analyze_state->vectors_per_segment;

		segment_count = 0;
		vector_count = 0;
		vector_in_segment_count = 0;
		tuple_count = 0;

		idx_t offset = NewSegment();
		SetCurrentBuffer(segment_handle);
		current_buffer_ptr = segment_handle.Ptr() + offset;
		D_ASSERT(GetCurrentOffset() <= GetWritableSpace(info));
	}